

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket_location_handler.c
# Opt level: O2

void test_ws_location_http_versions(void)

{
  int iVar1;
  cio_error cVar2;
  cio_http_cb_return cVar3;
  uint i;
  long lVar4;
  cio_websocket_location_handler handler;
  cio_http_client client;
  
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    iVar1 = (&DAT_001066d4)[lVar4 * 2];
    cVar2 = cio_websocket_location_handler_init
                      (&handler,(char **)0x0,0,on_connect,fake_handler_free);
    UnityAssertEqualNumber
              (0,(long)cVar2,"web socket handler initialization failed!",0x9f,
               UNITY_DISPLAY_STYLE_INT);
    client.add_response_header = fake_add_response_header;
    client.write_response = fake_write_response;
    client.parser._23_1_ = client.parser._23_1_ | 0x80;
    client.http_method = CIO_HTTP_GET;
    client._216_4_ = (&DAT_001066d0)[lVar4 * 2];
    handler.websocket.ws_private.http_client = &client;
    client.current_handler = &handler.http_location;
    cVar3 = (*handler.http_location.on_header_field_name)(&client,"Sec-WebSocket-Version",0x15);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_field returned wrong value for sec_ws_version_field",0xb0,
               UNITY_DISPLAY_STYLE_INT);
    cVar3 = (*handler.http_location.on_header_field_value)
                      (handler.websocket.ws_private.http_client,"13",2);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_value returned wrong value for sec_ws_version_value",0xb2,
               UNITY_DISPLAY_STYLE_INT);
    cVar3 = (*handler.http_location.on_header_field_name)
                      (handler.websocket.ws_private.http_client,"Sec-WebSocket-Key",0x11);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_field returned wrong value for sec_ws_key_field",0xb7,
               UNITY_DISPLAY_STYLE_INT);
    cVar3 = (*handler.http_location.on_header_field_value)
                      (handler.websocket.ws_private.http_client,"dGhlIHNhbXBsZSBub25jZQ==",0x18);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_value returned wrong value for sec_ws_key_value",0xb9,
               UNITY_DISPLAY_STYLE_INT);
    cVar3 = (*handler.http_location.on_headers_complete)(handler.websocket.ws_private.http_client);
    UnityAssertEqualNumber
              ((long)iVar1,(long)cVar3,"on_header_complete returned wrong value",0xbc,
               UNITY_DISPLAY_STYLE_INT);
    if ((long)iVar1 == 1) {
      UnityAssertEqualNumber
                (1,(ulong)fake_write_response_fake.call_count,"write_response was not called",0xbe,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (1,(ulong)on_connect_fake.call_count,"websocket on_connect was not called",0xbf,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (0x65,(ulong)fake_write_response_fake.arg1_val,
                 "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS",0xc0,
                 UNITY_DISPLAY_STYLE_INT);
    }
    setUp();
  }
  return;
}

Assistant:

static void test_ws_location_http_versions(void)
{
	struct upgrade_test {
		uint16_t major;
		uint16_t minor;
		enum cio_http_cb_return expected_ret_val;
	};

	struct upgrade_test tests[] = {
	    {.major = 1, .minor = 1, .expected_ret_val = CIO_HTTP_CB_SKIP_BODY},
	    {.major = 2, .minor = 0, .expected_ret_val = CIO_HTTP_CB_SKIP_BODY},
	    {.major = 1, .minor = 0, .expected_ret_val = CIO_HTTP_CB_ERROR},
	    {.major = 0, .minor = 9, .expected_ret_val = CIO_HTTP_CB_ERROR},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct upgrade_test test = tests[i];

		struct cio_websocket_location_handler handler;
		enum cio_error err = cio_websocket_location_handler_init(&handler, NULL, 0, on_connect, fake_handler_free);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "web socket handler initialization failed!");

		struct cio_http_client client;

		handler.websocket.ws_private.http_client = &client;
		handler.websocket.ws_private.http_client->current_handler = &handler.http_location;
		handler.websocket.ws_private.http_client->add_response_header = fake_add_response_header;
		handler.websocket.ws_private.http_client->write_response = fake_write_response;

		handler.websocket.ws_private.http_client->parser.upgrade = 1;
		handler.websocket.ws_private.http_client->http_method = CIO_HTTP_GET;
		handler.websocket.ws_private.http_client->http_major = test.major;
		handler.websocket.ws_private.http_client->http_minor = test.minor;

		static const char sec_ws_version_field[] = "Sec-WebSocket-Version";
		static const char sec_ws_version_value[] = "13";
		enum cio_http_cb_return cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_version_field, sizeof(sec_ws_version_field) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_version_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_version_value, sizeof(sec_ws_version_value) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_version_value");

		static const char sec_ws_key_field[] = "Sec-WebSocket-Key";
		static const char sec_ws_key_value[] = "dGhlIHNhbXBsZSBub25jZQ==";
		cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_key_field, sizeof(sec_ws_key_field) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_key_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_key_value, sizeof(sec_ws_key_value) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_key_value");

		cb_ret = handler.http_location.on_headers_complete(handler.websocket.ws_private.http_client);
		TEST_ASSERT_EQUAL_MESSAGE(test.expected_ret_val, cb_ret, "on_header_complete returned wrong value");
		if (test.expected_ret_val == CIO_HTTP_CB_SKIP_BODY) {
			TEST_ASSERT_EQUAL_MESSAGE(1, fake_write_response_fake.call_count, "write_response was not called");
			TEST_ASSERT_EQUAL_MESSAGE(1, on_connect_fake.call_count, "websocket on_connect was not called");
			TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_STATUS_SWITCHING_PROTOCOLS, fake_write_response_fake.arg1_val, "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS");
		}

		setUp();
	}
}